

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error TT_Vary_Apply_Glyph_Deltas
                   (TT_Face face,FT_UInt glyph_index,FT_Outline *outline,FT_UInt n_points)

{
  ushort uVar1;
  FT_Vector *pFVar2;
  FT_UShort FVar3;
  FT_UShort tupleIndex_00;
  FT_UShort FVar4;
  FT_Int32 FVar5;
  FT_Fixed FVar6;
  FT_Short *P;
  FT_Short *P_00;
  long lVar7;
  long lVar8;
  FT_Int32 b;
  FT_Alloc_Func local_160;
  FT_UInt local_154;
  FT_UInt local_13c;
  FT_Alloc_Func local_128;
  FT_Alloc_Func local_120;
  FT_Alloc_Func local_118;
  FT_Pos delta_y_1;
  FT_Pos delta_x_1;
  FT_UShort idx;
  FT_Pos delta_y;
  FT_Pos delta_x;
  FT_Fixed apply;
  FT_UInt tupleIndex;
  FT_UInt tupleDataSize;
  FT_Short *deltas_y;
  FT_Short *deltas_x;
  FT_UShort *points;
  FT_UShort *localpoints;
  FT_UShort *sharedpoints;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_Fixed *im_end_coords;
  FT_Fixed *im_start_coords;
  FT_Fixed *tuple_coords;
  FT_UInt j;
  FT_UInt i;
  FT_ULong here;
  FT_ULong offsetToData;
  long lStack_70;
  FT_UInt tupleCount;
  FT_ULong glyph_start;
  FT_Bool *pFStack_60;
  FT_Error error;
  FT_Bool *has_delta;
  FT_Vector *points_out;
  FT_Vector *points_org;
  GX_Blend blend;
  FT_Memory memory;
  FT_Stream stream;
  FT_Outline *pFStack_28;
  FT_UInt n_points_local;
  FT_Outline *outline_local;
  TT_Face pTStack_18;
  FT_UInt glyph_index_local;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  blend = (GX_Blend)((FT_Stream)memory)->memory;
  points_org = (FT_Vector *)face->blend;
  points_out = (FT_Vector *)0x0;
  has_delta = (FT_Bool *)0x0;
  pFStack_60 = (FT_Bool *)0x0;
  im_start_coords = (FT_Fixed *)0x0;
  im_end_coords = (FT_Fixed *)0x0;
  _spoint_count = (FT_Fixed *)0x0;
  sharedpoints._0_4_ = 0;
  localpoints = (FT_UShort *)0x0;
  points = (FT_UShort *)0x0;
  if ((face->doblend == '\0') || ((GX_Blend)points_org == (GX_Blend)0x0)) {
    face_local._4_4_ = 6;
  }
  else if ((glyph_index < ((GX_Blend)points_org)->gv_glyphcnt) &&
          (((GX_Blend)points_org)->glyphoffsets[glyph_index] !=
           ((GX_Blend)points_org)->glyphoffsets[glyph_index + 1])) {
    stream._4_4_ = n_points;
    pFStack_28 = outline;
    outline_local._4_4_ = glyph_index;
    pTStack_18 = face;
    points_out = (FT_Vector *)
                 ft_mem_realloc((FT_Memory)blend,0x10,0,(ulong)n_points,(void *)0x0,
                                (FT_Error *)((long)&glyph_start + 4));
    if ((((glyph_start._4_4_ == 0) &&
         (has_delta = (FT_Bool *)
                      ft_mem_realloc((FT_Memory)blend,0x10,0,(ulong)stream._4_4_,(void *)0x0,
                                     (FT_Error *)((long)&glyph_start + 4)), glyph_start._4_4_ == 0))
        && (pFStack_60 = (FT_Bool *)
                         ft_mem_realloc((FT_Memory)blend,1,0,(ulong)stream._4_4_,(void *)0x0,
                                        (FT_Error *)((long)&glyph_start + 4)),
           glyph_start._4_4_ == 0)) &&
       ((glyph_start._4_4_ =
              FT_Stream_Seek((FT_Stream)memory,
                             *(FT_ULong *)(points_org[8].x + (ulong)outline_local._4_4_ * 8)),
        glyph_start._4_4_ == 0 &&
        (glyph_start._4_4_ =
              FT_Stream_EnterFrame
                        ((FT_Stream)memory,
                         *(long *)(points_org[8].x + (ulong)(outline_local._4_4_ + 1) * 8) -
                         *(long *)(points_org[8].x + (ulong)outline_local._4_4_ * 8)),
        glyph_start._4_4_ == 0)))) {
      lStack_70 = (long)memory[2].user - (long)memory->user;
      im_start_coords =
           (FT_Fixed *)
           ft_mem_realloc((FT_Memory)blend,8,0,(ulong)(uint)points_org->x,(void *)0x0,
                          (FT_Error *)((long)&glyph_start + 4));
      if ((glyph_start._4_4_ == 0) &&
         ((im_end_coords =
                (FT_Fixed *)
                ft_mem_realloc((FT_Memory)blend,8,0,(ulong)(uint)points_org->x,(void *)0x0,
                               (FT_Error *)((long)&glyph_start + 4)), glyph_start._4_4_ == 0 &&
          (_spoint_count =
                (FT_Fixed *)
                ft_mem_realloc((FT_Memory)blend,8,0,(ulong)(uint)points_org->x,(void *)0x0,
                               (FT_Error *)((long)&glyph_start + 4)), glyph_start._4_4_ == 0)))) {
        FVar3 = FT_Stream_GetUShort((FT_Stream)memory);
        offsetToData._4_4_ = (uint)FVar3;
        FVar3 = FT_Stream_GetUShort((FT_Stream)memory);
        here = (FT_ULong)FVar3;
        if ((ulong)points_org[8].y < here + ((offsetToData._4_4_ & 0xfff) << 2)) {
          glyph_start._4_4_ = 8;
        }
        else {
          here = lStack_70 + here;
          if ((offsetToData._4_4_ & 0x8000) != 0) {
            _j = (long)memory[2].user - (long)memory->user;
            if (here < (ulong)((long)memory[2].alloc - (long)memory->user)) {
              local_118 = (FT_Alloc_Func)((long)memory->user + here);
            }
            else {
              local_118 = memory[2].alloc;
            }
            memory[2].user = local_118;
            localpoints = ft_var_readpackedpoints
                                    ((FT_Stream)memory,points_org[8].y,(FT_UInt *)&sharedpoints);
            here = (long)memory[2].user - (long)memory->user;
            if (_j < (ulong)((long)memory[2].alloc - (long)memory->user)) {
              local_120 = (FT_Alloc_Func)((long)memory->user + _j);
            }
            else {
              local_120 = memory[2].alloc;
            }
            memory[2].user = local_120;
          }
          for (tuple_coords._0_4_ = 0; (uint)tuple_coords < stream._4_4_;
              tuple_coords._0_4_ = (uint)tuple_coords + 1) {
            pFVar2 = pFStack_28->points;
            points_out[(uint)tuple_coords].x = pFVar2[(uint)tuple_coords].x;
            points_out[(uint)tuple_coords].y = pFVar2[(uint)tuple_coords].y;
          }
          for (tuple_coords._4_4_ = 0; tuple_coords._4_4_ < (offsetToData._4_4_ & 0xfff);
              tuple_coords._4_4_ = tuple_coords._4_4_ + 1) {
            FVar3 = FT_Stream_GetUShort((FT_Stream)memory);
            tupleIndex_00 = FT_Stream_GetUShort((FT_Stream)memory);
            if ((tupleIndex_00 & 0x8000) == 0) {
              if ((uint)points_org[6].y <= (tupleIndex_00 & 0xfff)) {
                glyph_start._4_4_ = 8;
                break;
              }
              memcpy(im_start_coords,
                     (void *)(points_org[7].x +
                             (ulong)((tupleIndex_00 & 0xfff) * (int)points_org->x) * 8),
                     (ulong)(uint)points_org->x << 3);
            }
            else {
              for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org->x;
                  tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                FVar4 = FT_Stream_GetUShort((FT_Stream)memory);
                im_start_coords[(uint)tuple_coords] = (long)((int)(short)FVar4 << 2);
              }
            }
            if ((tupleIndex_00 & 0x4000) != 0) {
              for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org->x;
                  tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                FVar4 = FT_Stream_GetUShort((FT_Stream)memory);
                im_end_coords[(uint)tuple_coords] = (long)((int)(short)FVar4 << 2);
              }
              for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org->x;
                  tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                FVar4 = FT_Stream_GetUShort((FT_Stream)memory);
                _spoint_count[(uint)tuple_coords] = (long)((int)(short)FVar4 << 2);
              }
            }
            FVar6 = ft_var_apply_tuple((GX_Blend)points_org,tupleIndex_00,im_start_coords,
                                       im_end_coords,_spoint_count);
            if (FVar6 == 0) {
              here = (uint)FVar3 + here;
            }
            else {
              _j = (long)memory[2].user - (long)memory->user;
              if (here < (ulong)((long)memory[2].alloc - (long)memory->user)) {
                local_128 = (FT_Alloc_Func)((long)memory->user + here);
              }
              else {
                local_128 = memory[2].alloc;
              }
              memory[2].user = local_128;
              if ((tupleIndex_00 & 0x2000) == 0) {
                deltas_x = (FT_Short *)localpoints;
                sharedpoints._4_4_ = (FT_UInt)sharedpoints;
              }
              else {
                deltas_x = (FT_Short *)
                           ft_var_readpackedpoints
                                     ((FT_Stream)memory,points_org[8].y,
                                      (FT_UInt *)((long)&sharedpoints + 4));
                points = (FT_UShort *)deltas_x;
              }
              if (sharedpoints._4_4_ == 0) {
                local_13c = stream._4_4_;
              }
              else {
                local_13c = sharedpoints._4_4_;
              }
              P = ft_var_readpackeddeltas((FT_Stream)memory,points_org[8].y,local_13c);
              if (sharedpoints._4_4_ == 0) {
                local_154 = stream._4_4_;
              }
              else {
                local_154 = sharedpoints._4_4_;
              }
              P_00 = ft_var_readpackeddeltas((FT_Stream)memory,points_org[8].y,local_154);
              if (((deltas_x != (FT_Short *)0x0) && (P_00 != (FT_Short *)0x0)) &&
                 (P != (FT_Short *)0x0)) {
                b = (FT_Int32)FVar6;
                if (deltas_x == (FT_Short *)0xffffffffffffffff) {
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < stream._4_4_;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    FVar5 = FT_MulFix_x86_64((int)P[(uint)tuple_coords],b);
                    lVar7 = (long)FVar5;
                    FVar5 = FT_MulFix_x86_64((int)P_00[(uint)tuple_coords],b);
                    lVar8 = (long)FVar5;
                    if ((uint)tuple_coords < stream._4_4_ - 4) {
                      pFStack_28->points[(uint)tuple_coords].x =
                           lVar7 + pFStack_28->points[(uint)tuple_coords].x;
                      pFStack_28->points[(uint)tuple_coords].y =
                           lVar8 + pFStack_28->points[(uint)tuple_coords].y;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 4) &&
                            ((pTStack_18->variation_support & 4) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].x =
                           lVar7 + pFStack_28->points[(uint)tuple_coords].x;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 3) &&
                            ((pTStack_18->variation_support & 2) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].x =
                           lVar7 + pFStack_28->points[(uint)tuple_coords].x;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 2) &&
                            ((pTStack_18->variation_support & 0x20) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].y =
                           lVar8 + pFStack_28->points[(uint)tuple_coords].y;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 1) &&
                            ((pTStack_18->variation_support & 0x10) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].y =
                           lVar8 + pFStack_28->points[(uint)tuple_coords].y;
                    }
                  }
                }
                else {
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < stream._4_4_;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    pFStack_60[(uint)tuple_coords] = '\0';
                    *(FT_Pos *)(has_delta + (ulong)(uint)tuple_coords * 0x10) =
                         points_out[(uint)tuple_coords].x;
                    *(FT_Pos *)((long)(has_delta + (ulong)(uint)tuple_coords * 0x10) + 8) =
                         points_out[(uint)tuple_coords].y;
                  }
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < sharedpoints._4_4_;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    uVar1 = deltas_x[(uint)tuple_coords];
                    if (uVar1 < stream._4_4_) {
                      pFStack_60[uVar1] = '\x01';
                      FVar5 = FT_MulFix_x86_64((int)P[(uint)tuple_coords],b);
                      *(long *)(has_delta + (ulong)uVar1 * 0x10) =
                           (long)FVar5 + *(long *)(has_delta + (ulong)uVar1 * 0x10);
                      FVar5 = FT_MulFix_x86_64((int)P_00[(uint)tuple_coords],b);
                      *(long *)(has_delta + (ulong)uVar1 * 0x10 + 8) =
                           (long)FVar5 + *(long *)(has_delta + (ulong)uVar1 * 0x10 + 8);
                    }
                  }
                  tt_interpolate_deltas(pFStack_28,(FT_Vector *)has_delta,points_out,pFStack_60);
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < stream._4_4_;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    lVar7 = *(long *)(has_delta + (ulong)(uint)tuple_coords * 0x10) -
                            points_out[(uint)tuple_coords].x;
                    lVar8 = *(long *)(has_delta + (ulong)(uint)tuple_coords * 0x10 + 8) -
                            points_out[(uint)tuple_coords].y;
                    if ((uint)tuple_coords < stream._4_4_ - 4) {
                      pFStack_28->points[(uint)tuple_coords].x =
                           lVar7 + pFStack_28->points[(uint)tuple_coords].x;
                      pFStack_28->points[(uint)tuple_coords].y =
                           lVar8 + pFStack_28->points[(uint)tuple_coords].y;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 4) &&
                            ((pTStack_18->variation_support & 4) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].x =
                           lVar7 + pFStack_28->points[(uint)tuple_coords].x;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 3) &&
                            ((pTStack_18->variation_support & 2) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].x =
                           lVar7 + pFStack_28->points[(uint)tuple_coords].x;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 2) &&
                            ((pTStack_18->variation_support & 0x20) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].y =
                           lVar8 + pFStack_28->points[(uint)tuple_coords].y;
                    }
                    else if (((uint)tuple_coords == stream._4_4_ - 1) &&
                            ((pTStack_18->variation_support & 0x10) == 0)) {
                      pFStack_28->points[(uint)tuple_coords].y =
                           lVar8 + pFStack_28->points[(uint)tuple_coords].y;
                    }
                  }
                }
              }
              if (points != (FT_UShort *)0xffffffffffffffff) {
                ft_mem_free((FT_Memory)blend,points);
                points = (FT_UShort *)0x0;
              }
              ft_mem_free((FT_Memory)blend,P);
              ft_mem_free((FT_Memory)blend,P_00);
              here = (uint)FVar3 + here;
              if (_j < (ulong)((long)memory[2].alloc - (long)memory->user)) {
                local_160 = (FT_Alloc_Func)((long)memory->user + _j);
              }
              else {
                local_160 = memory[2].alloc;
              }
              memory[2].user = local_160;
            }
          }
        }
      }
      if (localpoints != (FT_UShort *)0xffffffffffffffff) {
        ft_mem_free((FT_Memory)blend,localpoints);
      }
      ft_mem_free((FT_Memory)blend,im_start_coords);
      im_start_coords = (FT_Fixed *)0x0;
      ft_mem_free((FT_Memory)blend,im_end_coords);
      im_end_coords = (FT_Fixed *)0x0;
      ft_mem_free((FT_Memory)blend,_spoint_count);
      _spoint_count = (FT_Fixed *)0x0;
      FT_Stream_ExitFrame((FT_Stream)memory);
    }
    ft_mem_free((FT_Memory)blend,points_out);
    points_out = (FT_Vector *)0x0;
    ft_mem_free((FT_Memory)blend,has_delta);
    has_delta = (FT_Bool *)0x0;
    ft_mem_free((FT_Memory)blend,pFStack_60);
    face_local._4_4_ = glyph_start._4_4_;
  }
  else {
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Face      face,
                              FT_UInt      glyph_index,
                              FT_Outline*  outline,
                              FT_UInt      n_points )
  {
    FT_Stream   stream = face->root.stream;
    FT_Memory   memory = stream->memory;
    GX_Blend    blend  = face->blend;

    FT_Vector*  points_org = NULL;
    FT_Vector*  points_out = NULL;
    FT_Bool*    has_delta  = NULL;

    FT_Error    error;
    FT_ULong    glyph_start;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short    *deltas_x, *deltas_y;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for this glyph\n" ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] )   ||
         FT_FRAME_ENTER( blend->glyphoffsets[glyph_index + 1] -
                           blend->glyphoffsets[glyph_index] ) )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           blend->gvar_size )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    for ( j = 0; j < n_points; j++ )
      points_org[j] = outline->points[j];

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;   /* convert from        */
                                                  /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail2;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Pos  delta_y = FT_MulFix( deltas_y[j], apply );


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  delta_y = points_out[j].y - points_org[j].y;


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }